

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall Logger::~Logger(Logger *this)

{
  ostream *poVar1;
  
  poVar1 = GetStream(this->severity_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::ostream::flush();
  if (this->severity_ != FATAL) {
    return;
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  abort();
}

Assistant:

Logger::~Logger() {
  GetStream(severity_) << "\n" << std::flush;
  if (severity_ == FATAL) {
    info_log_file_.close();
    warn_log_file_.close();
    erro_log_file_.close();
    abort();
  }
}